

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O2

bool __thiscall
MIDIplay::doUniversalSysEx(MIDIplay *this,uint dev,bool realtime,uint8_t *data,size_t size)

{
  OPL3 *pOVar1;
  uint uVar2;
  DebugMessageHook p_Var3;
  uint32_t uVar4;
  char *pcVar5;
  void *pvVar6;
  size_t ch;
  ulong uVar7;
  
  if (size < 2) {
    return false;
  }
  if (dev != 0x7f && this->m_sysExDeviceId != dev) {
    return false;
  }
  uVar2 = (uint)realtime << 0x10 | data[1] & 0x7f | (*data & 0x7f) << 8;
  if (uVar2 == 0x10401) {
    if (size == 4) {
      pOVar1 = (this->m_synth).m_p;
      if (pOVar1 != (OPL3 *)0x0) {
        pOVar1->m_masterVolume = data[3] & 0x7f;
      }
      for (uVar7 = 0;
          uVar7 < (ulong)(((long)(this->m_midiChannels).
                                 super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_midiChannels).
                                super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x140);
          uVar7 = uVar7 + 1) {
        noteUpdateAll(this,uVar7 & 0xffff,4);
      }
      return true;
    }
    return false;
  }
  if (uVar2 == 0x902) {
    p_Var3 = (this->hooks).onDebugMessage;
    uVar4 = 2;
    if (p_Var3 == (DebugMessageHook)0x0) goto LAB_00131182;
    pvVar6 = (this->hooks).onDebugMessage_userData;
    pcVar5 = "SysEx: GM System Off";
  }
  else {
    if (uVar2 != 0x901) {
      return false;
    }
    p_Var3 = (this->hooks).onDebugMessage;
    if (p_Var3 == (DebugMessageHook)0x0) {
      uVar4 = 0;
      goto LAB_00131182;
    }
    pvVar6 = (this->hooks).onDebugMessage_userData;
    pcVar5 = "SysEx: GM System On";
    uVar4 = 0;
  }
  (*p_Var3)(pvVar6,pcVar5);
LAB_00131182:
  this->m_synthMode = uVar4;
  realTime_ResetState(this);
  return true;
}

Assistant:

bool MIDIplay::doUniversalSysEx(unsigned dev, bool realtime, const uint8_t *data, size_t size)
{
    bool devicematch = dev == 0x7F || dev == m_sysExDeviceId;
    if(size < 2 || !devicematch)
        return false;

    unsigned address =
        (((unsigned)data[0] & 0x7F) << 8) |
        (((unsigned)data[1] & 0x7F));
    data += 2;
    size -= 2;

    switch(((unsigned)realtime << 16) | address)
    {
        case (0 << 16) | 0x0901: // GM System On
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: GM System On");
            m_synthMode = Mode_GM;
            realTime_ResetState();
            return true;
        case (0 << 16) | 0x0902: // GM System Off
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: GM System Off");
            m_synthMode = Mode_XG;//TODO: TEMPORARY, make something RIGHT
            realTime_ResetState();
            return true;
        case (1 << 16) | 0x0401: // MIDI Master Volume
            if(size != 2)
                break;
            unsigned volume =
                (((unsigned)data[0] & 0x7F)) |
                (((unsigned)data[1] & 0x7F) << 7);
            if(m_synth.get())
                m_synth->m_masterVolume = static_cast<uint8_t>(volume >> 7);
            for(size_t ch = 0; ch < m_midiChannels.size(); ch++)
                noteUpdateAll(uint16_t(ch), Upd_Volume);
            return true;
    }

    return false;
}